

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeverityControl.cpp
# Opt level: O1

int main(void)

{
  pthread_mutex_t *ppVar1;
  __atomic_base<unsigned_long> _Var2;
  atomic<unsigned_long> aVar3;
  int iVar4;
  size_t sVar5;
  Session *pSVar6;
  undefined8 uVar7;
  basic_ostream<char,_std::char_traits<char>_> *in_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_01;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_02;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_03;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_04;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_05;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_06;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_07;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_08;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_09;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_10;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_11;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_12;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_13;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_14;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_15;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_16;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_17;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_18;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_19;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_20;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_21;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_22;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_23;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_24;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_25;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_26;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_27;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_28;
  SessionWriter *this;
  char *__end;
  uint64_t clock;
  long *in_FS_OFFSET;
  timespec ts;
  ConsumeResult local_a68;
  SessionWriter *local_a48;
  undefined1 local_a40 [16];
  _Alloc_hider local_a30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a20;
  _Alloc_hider local_a10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a00;
  _Alloc_hider local_9f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9e0;
  uint64_t local_9d0;
  _Alloc_hider local_9c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9b8;
  _Alloc_hider local_9a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_998;
  undefined1 local_988 [16];
  _Alloc_hider local_978;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_968;
  _Alloc_hider local_958;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_948;
  _Alloc_hider local_938;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_928;
  uint64_t local_918;
  _Alloc_hider local_910;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_900;
  _Alloc_hider local_8f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e0;
  undefined1 local_8d0 [16];
  _Alloc_hider local_8c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8b0;
  _Alloc_hider local_8a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_890;
  _Alloc_hider local_880;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_870;
  uint64_t local_860;
  _Alloc_hider local_858;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_848;
  _Alloc_hider local_838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828;
  undefined1 local_818 [16];
  _Alloc_hider local_808;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7f8;
  _Alloc_hider local_7e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7d8;
  _Alloc_hider local_7c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8;
  uint64_t local_7a8;
  _Alloc_hider local_7a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_790;
  _Alloc_hider local_780;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_770;
  undefined1 local_760 [16];
  _Alloc_hider local_750;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_740;
  _Alloc_hider local_730;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_720;
  _Alloc_hider local_710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_700;
  uint64_t local_6f0;
  _Alloc_hider local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8;
  _Alloc_hider local_6c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8;
  undefined1 local_6a8 [16];
  _Alloc_hider local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688;
  _Alloc_hider local_678;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  _Alloc_hider local_658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  uint64_t local_638;
  _Alloc_hider local_630;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_620;
  _Alloc_hider local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  undefined1 local_5f0 [16];
  _Alloc_hider local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d0;
  _Alloc_hider local_5c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0;
  _Alloc_hider local_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_590;
  uint64_t local_580;
  _Alloc_hider local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  _Alloc_hider local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  undefined1 local_538 [16];
  _Alloc_hider local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  _Alloc_hider local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  _Alloc_hider local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  uint64_t local_4c8;
  _Alloc_hider local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  _Alloc_hider local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  undefined1 local_480 [16];
  _Alloc_hider local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  _Alloc_hider local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  _Alloc_hider local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  uint64_t local_410;
  _Alloc_hider local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  _Alloc_hider local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined1 local_3c8 [16];
  _Alloc_hider local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Alloc_hider local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  uint64_t local_358;
  _Alloc_hider local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  _Alloc_hider local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  undefined1 local_310 [16];
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Alloc_hider local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  uint64_t local_2a0;
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined1 local_258 [16];
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  uint64_t local_1e8;
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [16];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  uint64_t local_130;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  uint64_t local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (binlog::default_session()::s_session == '\0') {
    iVar4 = __cxa_guard_acquire();
    in_RDX = extraout_RDX_27;
    if (iVar4 != 0) {
      binlog::Session::Session(&binlog::default_session::s_session);
      __cxa_atexit(binlog::Session::~Session,&binlog::default_session::s_session,&__dso_handle);
      __cxa_guard_release();
      in_RDX = extraout_RDX_28;
    }
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_1();
    in_RDX = extraout_RDX_13;
  }
  this = (SessionWriter *)(*in_FS_OFFSET + -0x38);
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x21) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i != 0) {
LAB_001037f3:
      aVar3.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_3();
      }
      local_a68.bytesConsumed = 0;
      local_a68.totalBytesConsumed = 0;
      clock_gettime(0,(timespec *)&local_a68);
      binlog::SessionWriter::addEvent<>
                (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
                 local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed);
      in_RDX = extraout_RDX;
      goto LAB_0010382c;
    }
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_2();
    }
    ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
    local_1a0._0_8_ = 0;
    local_1a0._8_2_ = trace;
    local_190._M_p = (pointer)&local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"main","");
    local_170._M_p = (pointer)&local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"main","");
    local_150._M_p = (pointer)&local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,
               "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
               ,"");
    local_130 = 0x13;
    local_128._M_p = (pointer)&local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Default","");
    local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffffffffff00;
    local_108._M_p = (pointer)&local_f8;
    sVar5 = strlen((char *)&local_a68);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
    iVar4 = pthread_mutex_lock(ppVar1);
    if (iVar4 == 0) {
      local_1a0._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_1a0,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_p != &local_118) {
        operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_p != &local_140) {
        operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_p != &local_160) {
        operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != &local_180) {
        operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
      goto LAB_001037f3;
    }
    iVar4 = std::__throw_system_error(iVar4);
LAB_00106281:
    iVar4 = std::__throw_system_error(iVar4);
LAB_00106288:
    iVar4 = std::__throw_system_error(iVar4);
LAB_0010628f:
    iVar4 = std::__throw_system_error(iVar4);
LAB_00106296:
    iVar4 = std::__throw_system_error(iVar4);
LAB_0010629d:
    iVar4 = std::__throw_system_error(iVar4);
LAB_001062a4:
    iVar4 = std::__throw_system_error(iVar4);
LAB_001062ab:
    iVar4 = std::__throw_system_error(iVar4);
LAB_001062b2:
    iVar4 = std::__throw_system_error(iVar4);
LAB_001062b9:
    iVar4 = std::__throw_system_error(iVar4);
LAB_001062c0:
    iVar4 = std::__throw_system_error(iVar4);
LAB_001062c7:
    iVar4 = std::__throw_system_error(iVar4);
LAB_001062ce:
    iVar4 = std::__throw_system_error(iVar4);
LAB_001062d5:
    uVar7 = std::__throw_system_error(iVar4);
    __cxa_guard_abort(&binlog::default_session()::s_session);
    _Unwind_Resume(uVar7);
  }
LAB_0010382c:
  binlog::default_session::s_session._minSeverity._M_i = no_logs;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_4();
    in_RDX = extraout_RDX_14;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x401) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_5();
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_258._0_8_ = 0;
      local_258._8_2_ = critical;
      local_248._M_p = (pointer)&local_238;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"main","");
      local_228._M_p = (pointer)&local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"main","");
      local_208._M_p = (pointer)&local_1f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,"");
      local_1e8 = 0x17;
      local_1e0._M_p = (pointer)&local_1d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"Disabled","");
      local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffffffffff00;
      local_1c0._M_p = (pointer)&local_1b0;
      sVar5 = strlen((char *)&local_a68);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c0,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock(ppVar1);
      if (iVar4 != 0) goto LAB_00106281;
      local_258._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_258,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_p != &local_1b0) {
        operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_p != &local_1d0) {
        operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_p != &local_1f8) {
        operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_p != &local_218) {
        operator_delete(local_228._M_p,local_218._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_p != &local_238) {
        operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_6();
    }
    local_a68.bytesConsumed = 0;
    local_a68.totalBytesConsumed = 0;
    clock_gettime(0,(timespec *)&local_a68);
    binlog::SessionWriter::addEvent<>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed);
    in_RDX = extraout_RDX_00;
  }
  binlog::default_session::s_session._minSeverity._M_i = critical;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_7();
    in_RDX = extraout_RDX_15;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x401) {
    if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_8();
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_310._0_8_ = 0;
      local_310._8_2_ = critical;
      local_300._M_p = (pointer)&local_2f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"main","");
      local_2e0._M_p = (pointer)&local_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"main","");
      local_2c0._M_p = (pointer)&local_2b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,"");
      local_2a0 = 0x1a;
      local_298._M_p = (pointer)&local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Enabled","");
      local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffffffffff00;
      local_278._M_p = (pointer)&local_268;
      sVar5 = strlen((char *)&local_a68);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock(ppVar1);
      if (iVar4 != 0) goto LAB_00106288;
      local_310._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_310,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_p != &local_268) {
        operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_p != &local_288) {
        operator_delete(local_298._M_p,local_288._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_p != &local_2b0) {
        operator_delete(local_2c0._M_p,local_2b0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_p != &local_2d0) {
        operator_delete(local_2e0._M_p,local_2d0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_p != &local_2f0) {
        operator_delete(local_300._M_p,local_2f0._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_9();
    }
    local_a68.bytesConsumed = 0;
    local_a68.totalBytesConsumed = 0;
    clock_gettime(0,(timespec *)&local_a68);
    binlog::SessionWriter::addEvent<>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed);
    in_RDX = extraout_RDX_01;
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_10();
    in_RDX = extraout_RDX_16;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
    if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_11();
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_3c8._0_8_ = 0;
      local_3c8._8_2_ = error;
      local_3b8._M_p = (pointer)&local_3a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"main","");
      local_398._M_p = (pointer)&local_388;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"main","");
      local_378._M_p = (pointer)&local_368;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_378,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,"");
      local_358 = 0x1b;
      local_350._M_p = (pointer)&local_340;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"Disabled","");
      local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffffffffff00;
      local_330._M_p = (pointer)&local_320;
      sVar5 = strlen((char *)&local_a68);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_330,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock(ppVar1);
      if (iVar4 != 0) goto LAB_0010628f;
      local_3c8._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_3c8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_p != &local_320) {
        operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_p != &local_340) {
        operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_p != &local_368) {
        operator_delete(local_378._M_p,local_368._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_p != &local_388) {
        operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_p != &local_3a8) {
        operator_delete(local_3b8._M_p,local_3a8._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_12();
    }
    local_a68.bytesConsumed = 0;
    local_a68.totalBytesConsumed = 0;
    clock_gettime(0,(timespec *)&local_a68);
    binlog::SessionWriter::addEvent<>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed);
    in_RDX = extraout_RDX_02;
  }
  binlog::default_session::s_session._minSeverity._M_i = error;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_13();
    in_RDX = extraout_RDX_17;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
    if (main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_14();
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_480._0_8_ = 0;
      local_480._8_2_ = error;
      local_470._M_p = (pointer)&local_460;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"main","");
      local_450._M_p = (pointer)&local_440;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"main","");
      local_430._M_p = (pointer)&local_420;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_430,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,"");
      local_410 = 0x1f;
      local_408._M_p = (pointer)&local_3f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"Enabled","");
      local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffffffffff00;
      local_3e8._M_p = (pointer)&local_3d8;
      sVar5 = strlen((char *)&local_a68);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3e8,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock(ppVar1);
      if (iVar4 != 0) goto LAB_00106296;
      local_480._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_480,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_p != &local_3d8) {
        operator_delete(local_3e8._M_p,local_3d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_p != &local_3f8) {
        operator_delete(local_408._M_p,local_3f8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_p != &local_420) {
        operator_delete(local_430._M_p,local_420._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_p != &local_440) {
        operator_delete(local_450._M_p,local_440._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_p != &local_460) {
        operator_delete(local_470._M_p,local_460._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_15();
    }
    local_a68.bytesConsumed = 0;
    local_a68.totalBytesConsumed = 0;
    clock_gettime(0,(timespec *)&local_a68);
    binlog::SessionWriter::addEvent<>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed);
    in_RDX = extraout_RDX_03;
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_16();
    in_RDX = extraout_RDX_18;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x101) {
    if (main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_17();
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_538._0_8_ = 0;
      local_538._8_2_ = warning;
      local_528._M_p = (pointer)&local_518;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"main","");
      local_508._M_p = (pointer)&local_4f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"main","");
      local_4e8._M_p = (pointer)&local_4d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,"");
      local_4c8 = 0x20;
      local_4c0._M_p = (pointer)&local_4b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"Disabled","");
      local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffffffffff00;
      local_4a0._M_p = (pointer)&local_490;
      sVar5 = strlen((char *)&local_a68);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4a0,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock(ppVar1);
      if (iVar4 != 0) goto LAB_0010629d;
      local_538._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_538,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_p != &local_490) {
        operator_delete(local_4a0._M_p,local_490._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_p != &local_4b0) {
        operator_delete(local_4c0._M_p,local_4b0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_p != &local_4d8) {
        operator_delete(local_4e8._M_p,local_4d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_p != &local_4f8) {
        operator_delete(local_508._M_p,local_4f8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_p != &local_518) {
        operator_delete(local_528._M_p,local_518._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_18();
    }
    local_a68.bytesConsumed = 0;
    local_a68.totalBytesConsumed = 0;
    clock_gettime(0,(timespec *)&local_a68);
    binlog::SessionWriter::addEvent<>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed);
    in_RDX = extraout_RDX_04;
  }
  binlog::default_session::s_session._minSeverity._M_i = warning;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_19();
    in_RDX = extraout_RDX_19;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x101) {
    if (main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_20();
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_5f0._0_8_ = 0;
      local_5f0._8_2_ = warning;
      local_5e0._M_p = (pointer)&local_5d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"main","");
      local_5c0._M_p = (pointer)&local_5b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"main","");
      local_5a0._M_p = (pointer)&local_590;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_5a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,"");
      local_580 = 0x24;
      local_578._M_p = (pointer)&local_568;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"Enabled","");
      local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffffffffff00;
      local_558._M_p = (pointer)&local_548;
      sVar5 = strlen((char *)&local_a68);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_558,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock(ppVar1);
      if (iVar4 != 0) goto LAB_001062a4;
      local_5f0._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_5f0,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_p != &local_548) {
        operator_delete(local_558._M_p,local_548._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_p != &local_568) {
        operator_delete(local_578._M_p,local_568._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a0._M_p != &local_590) {
        operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._M_p != &local_5b0) {
        operator_delete(local_5c0._M_p,local_5b0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e0._M_p != &local_5d0) {
        operator_delete(local_5e0._M_p,local_5d0._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_21();
    }
    local_a68.bytesConsumed = 0;
    local_a68.totalBytesConsumed = 0;
    clock_gettime(0,(timespec *)&local_a68);
    binlog::SessionWriter::addEvent<>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed);
    in_RDX = extraout_RDX_05;
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_22();
    in_RDX = extraout_RDX_20;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_23();
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_6a8._0_8_ = 0;
      local_6a8._8_2_ = info;
      local_698._M_p = (pointer)&local_688;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"main","");
      local_678._M_p = (pointer)&local_668;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"main","");
      local_658._M_p = (pointer)&local_648;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_658,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,"");
      local_638 = 0x25;
      local_630._M_p = (pointer)&local_620;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"Disabled","");
      local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffffffffff00;
      local_610._M_p = (pointer)&local_600;
      sVar5 = strlen((char *)&local_a68);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_610,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock(ppVar1);
      if (iVar4 != 0) goto LAB_001062ab;
      local_6a8._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_6a8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610._M_p != &local_600) {
        operator_delete(local_610._M_p,local_600._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_630._M_p != &local_620) {
        operator_delete(local_630._M_p,local_620._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_658._M_p != &local_648) {
        operator_delete(local_658._M_p,local_648._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678._M_p != &local_668) {
        operator_delete(local_678._M_p,local_668._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_698._M_p != &local_688) {
        operator_delete(local_698._M_p,local_688._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_24();
    }
    local_a68.bytesConsumed = 0;
    local_a68.totalBytesConsumed = 0;
    clock_gettime(0,(timespec *)&local_a68);
    binlog::SessionWriter::addEvent<>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed);
    in_RDX = extraout_RDX_06;
  }
  binlog::default_session::s_session._minSeverity._M_i = info;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_25();
    in_RDX = extraout_RDX_21;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_26();
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_760._0_8_ = 0;
      local_760._8_2_ = info;
      local_750._M_p = (pointer)&local_740;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"main","");
      local_730._M_p = (pointer)&local_720;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"main","");
      local_710._M_p = (pointer)&local_700;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_710,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,"");
      local_6f0 = 0x29;
      local_6e8._M_p = (pointer)&local_6d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"Enabled","");
      local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffffffffff00;
      local_6c8._M_p = (pointer)&local_6b8;
      sVar5 = strlen((char *)&local_a68);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6c8,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock(ppVar1);
      if (iVar4 != 0) goto LAB_001062b2;
      local_760._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_760,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c8._M_p != &local_6b8) {
        operator_delete(local_6c8._M_p,local_6b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e8._M_p != &local_6d8) {
        operator_delete(local_6e8._M_p,local_6d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_710._M_p != &local_700) {
        operator_delete(local_710._M_p,local_700._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_730._M_p != &local_720) {
        operator_delete(local_730._M_p,local_720._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_750._M_p != &local_740) {
        operator_delete(local_750._M_p,local_740._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_27();
    }
    local_a68.bytesConsumed = 0;
    local_a68.totalBytesConsumed = 0;
    clock_gettime(0,(timespec *)&local_a68);
    binlog::SessionWriter::addEvent<>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed);
    in_RDX = extraout_RDX_07;
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_28();
    in_RDX = extraout_RDX_22;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x41) {
    if (main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_29();
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_818._0_8_ = 0;
      local_818._8_2_ = debug;
      local_808._M_p = (pointer)&local_7f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"main","");
      local_7e8._M_p = (pointer)&local_7d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e8,"main","");
      local_7c8._M_p = (pointer)&local_7b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,"");
      local_7a8 = 0x2a;
      local_7a0._M_p = (pointer)&local_790;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"Disabled","");
      local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffffffffff00;
      local_780._M_p = (pointer)&local_770;
      sVar5 = strlen((char *)&local_a68);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_780,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock(ppVar1);
      if (iVar4 != 0) goto LAB_001062b9;
      local_818._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_818,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_780._M_p != &local_770) {
        operator_delete(local_780._M_p,local_770._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a0._M_p != &local_790) {
        operator_delete(local_7a0._M_p,local_790._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_p != &local_7b8) {
        operator_delete(local_7c8._M_p,local_7b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._M_p != &local_7d8) {
        operator_delete(local_7e8._M_p,local_7d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_808._M_p != &local_7f8) {
        operator_delete(local_808._M_p,local_7f8._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_30();
    }
    local_a68.bytesConsumed = 0;
    local_a68.totalBytesConsumed = 0;
    clock_gettime(0,(timespec *)&local_a68);
    binlog::SessionWriter::addEvent<>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed);
    in_RDX = extraout_RDX_08;
  }
  binlog::default_session::s_session._minSeverity._M_i = debug;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_31();
    in_RDX = extraout_RDX_23;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x41) {
    if (main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_32();
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_8d0._0_8_ = 0;
      local_8d0._8_2_ = debug;
      local_8c0._M_p = (pointer)&local_8b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c0,"main","");
      local_8a0._M_p = (pointer)&local_890;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a0,"main","");
      local_880._M_p = (pointer)&local_870;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_880,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,"");
      local_860 = 0x2e;
      local_858._M_p = (pointer)&local_848;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"Enabled","");
      local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffffffffff00;
      local_838._M_p = (pointer)&local_828;
      sVar5 = strlen((char *)&local_a68);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_838,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock(ppVar1);
      if (iVar4 != 0) goto LAB_001062c0;
      local_8d0._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_8d0,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_838._M_p != &local_828) {
        operator_delete(local_838._M_p,local_828._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_858._M_p != &local_848) {
        operator_delete(local_858._M_p,local_848._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_880._M_p != &local_870) {
        operator_delete(local_880._M_p,local_870._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8a0._M_p != &local_890) {
        operator_delete(local_8a0._M_p,local_890._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8c0._M_p != &local_8b0) {
        operator_delete(local_8c0._M_p,local_8b0._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_33();
    }
    local_a68.bytesConsumed = 0;
    local_a68.totalBytesConsumed = 0;
    clock_gettime(0,(timespec *)&local_a68);
    binlog::SessionWriter::addEvent<>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed);
    in_RDX = extraout_RDX_09;
  }
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_34();
    in_RDX = extraout_RDX_24;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x21) {
    if (main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_35();
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_988._0_8_ = 0;
      local_988._8_2_ = trace;
      local_978._M_p = (pointer)&local_968;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_978,"main","");
      local_958._M_p = (pointer)&local_948;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_958,"main","");
      local_938._M_p = (pointer)&local_928;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_938,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,"");
      local_918 = 0x2f;
      local_910._M_p = (pointer)&local_900;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"Disabled","");
      local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffffffffff00;
      local_8f0._M_p = (pointer)&local_8e0;
      sVar5 = strlen((char *)&local_a68);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_8f0,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock(ppVar1);
      if (iVar4 != 0) goto LAB_001062c7;
      local_988._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_988,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8f0._M_p != &local_8e0) {
        operator_delete(local_8f0._M_p,local_8e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_910._M_p != &local_900) {
        operator_delete(local_910._M_p,local_900._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_938._M_p != &local_928) {
        operator_delete(local_938._M_p,local_928._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_958._M_p != &local_948) {
        operator_delete(local_958._M_p,local_948._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_978._M_p != &local_968) {
        operator_delete(local_978._M_p,local_968._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_36();
    }
    local_a68.bytesConsumed = 0;
    local_a68.totalBytesConsumed = 0;
    clock_gettime(0,(timespec *)&local_a68);
    binlog::SessionWriter::addEvent<>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed);
    in_RDX = extraout_RDX_10;
  }
  binlog::default_session::s_session._minSeverity._M_i = trace;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_37();
    in_RDX = extraout_RDX_25;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x21) {
    if (main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_38();
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_a40._0_8_ = 0;
      local_a40._8_2_ = trace;
      local_a30._M_p = (pointer)&local_a20;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,"main","");
      local_a10._M_p = (pointer)&local_a00;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a10,"main","");
      local_9f0._M_p = (pointer)&local_9e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_9f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,"");
      local_9d0 = 0x33;
      local_9c8._M_p = (pointer)&local_9b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c8,"Enabled","");
      local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffffffffff00;
      local_9a8._M_p = (pointer)&local_998;
      sVar5 = strlen((char *)&local_a68);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_9a8,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock(ppVar1);
      if (iVar4 != 0) goto LAB_001062ce;
      local_a40._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_a40,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9a8._M_p != &local_998) {
        operator_delete(local_9a8._M_p,local_998._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9c8._M_p != &local_9b8) {
        operator_delete(local_9c8._M_p,local_9b8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9f0._M_p != &local_9e0) {
        operator_delete(local_9f0._M_p,local_9e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a10._M_p != &local_a00) {
        operator_delete(local_a10._M_p,local_a00._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a30._M_p != &local_a20) {
        operator_delete(local_a30._M_p,local_a20._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_39();
    }
    local_a68.bytesConsumed = 0;
    local_a68.totalBytesConsumed = 0;
    clock_gettime(0,(timespec *)&local_a68);
    binlog::SessionWriter::addEvent<>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,
               local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed);
    in_RDX = extraout_RDX_11;
  }
  binlog::default_session::s_session._minSeverity._M_i = warning;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar6 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
    main_cold_40();
    in_RDX = extraout_RDX_26;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (main::_binlog_sid_13.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar6 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
        main_cold_41();
      }
      ppVar1 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_e8._0_8_ = 0;
      local_e8._8_2_ = info;
      local_d8._M_p = (pointer)&local_c8;
      local_a48 = this;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"main","");
      local_b8._M_p = (pointer)&local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"main","");
      local_98._M_p = (pointer)&local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,"");
      local_78 = 0x40;
      local_70._M_p = (pointer)&local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Call f: {}","");
      f();
      local_a68.bytesConsumed = CONCAT62(local_a68.bytesConsumed._2_6_,0x69);
      local_50._M_p = (pointer)&local_40;
      sVar5 = strlen((char *)&local_a68);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,&local_a68,(long)&local_a68.bytesConsumed + sVar5);
      iVar4 = pthread_mutex_lock(ppVar1);
      if (iVar4 != 0) goto LAB_001062d5;
      local_e8._0_8_ = ppVar1[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_e8,(RecoverableVectorOutputStream *)((long)ppVar1 + 0x58));
      _Var2._M_i = ppVar1[3].__align;
      ppVar1[3].__align = _Var2._M_i + 1;
      pthread_mutex_unlock(ppVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      this = local_a48;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_p != &local_c8) {
        operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_13.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar3.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_13.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar6 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar6,0x100000,0,(string *)&local_a68);
      main_cold_42();
    }
    local_a68.bytesConsumed = 0;
    local_a68.totalBytesConsumed = 0;
    clock_gettime(0,(timespec *)&local_a68);
    clock = local_a68.bytesConsumed * 1000000000 + local_a68.totalBytesConsumed;
    f();
    local_a68.bytesConsumed = local_a68.bytesConsumed & 0xffffffff00000000;
    binlog::SessionWriter::addEvent<int>
              (this,(uint64_t)aVar3.super___atomic_base<unsigned_long>._M_i,clock,(int *)&local_a68)
    ;
    in_RDX = extraout_RDX_12;
  }
  binlog::consume<std::ostream>(&local_a68,(binlog *)&std::cout,in_RDX);
  return 0;
}

Assistant:

int main()
{
  binlog::Session& session = binlog::default_session();
  BINLOG_TRACE("Default");
  // Outputs: TRAC Default

  session.setMinSeverity(binlog::Severity::no_logs);
  BINLOG_CRITICAL("Disabled");

  session.setMinSeverity(binlog::Severity::critical);
  BINLOG_CRITICAL("Enabled");
  BINLOG_ERROR("Disabled");
  // Outputs: CRIT Enabled

  session.setMinSeverity(binlog::Severity::error);
  BINLOG_ERROR("Enabled");
  BINLOG_WARN("Disabled");
  // Outputs: ERRO Enabled

  session.setMinSeverity(binlog::Severity::warning);
  BINLOG_WARN("Enabled");
  BINLOG_INFO("Disabled");
  // Outputs: WARN Enabled

  session.setMinSeverity(binlog::Severity::info);
  BINLOG_INFO("Enabled");
  BINLOG_DEBUG("Disabled");
  // Outputs: INFO Enabled

  session.setMinSeverity(binlog::Severity::debug);
  BINLOG_DEBUG("Enabled");
  BINLOG_TRACE("Disabled");
  // Outputs: DEBG Enabled

  session.setMinSeverity(binlog::Severity::trace);
  BINLOG_TRACE("Enabled");
  // Outputs: TRAC Enabled

  // Arguments of disabled severities are not evaluated:

  //[setmin

  session.setMinSeverity(binlog::Severity::warning);
  // trace, debug, info severities are disabled
  //]

  //[noeval
  // after setting min severity to warning above:
  BINLOG_INFO("Call f: {}", f()); // f will not be called
  //]

  binlog::consume(std::cout);
  return 0;
}